

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O1

MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *
vkt::wsi::anon_unknown_0::createDisplay
          (MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *__return_storage_ptr__,
          Platform *platform,Extensions *supportedExtensions,Type wsiType)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*platform->_vptr_Platform[1])(platform,(ulong)wsiType);
  (__return_storage_ptr__->super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
  ).m_data.ptr = (Display *)CONCAT44(extraout_var,iVar1);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Display> createDisplay (const vk::Platform&	platform,
								const Extensions&	supportedExtensions,
								Type				wsiType)
{
	try
	{
		return MovePtr<Display>(platform.createWsiDisplay(wsiType));
	}
	catch (const tcu::NotSupportedError& e)
	{
		if (isExtensionSupported(supportedExtensions, RequiredExtension(getExtensionName(wsiType))))
		{
			// If VK_KHR_{platform}_surface was supported, vk::Platform implementation
			// must support creating native display & window for that WSI type.
			throw tcu::TestError(e.getMessage());
		}
		else
			throw;
	}
}